

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLNode::DeleteChildren(XMLNode *this)

{
  XMLNode *in_RDI;
  XMLNode *node;
  XMLNode *child;
  
  while (in_RDI->_firstChild != (XMLNode *)0x0) {
    child = in_RDI->_firstChild;
    Unlink(in_RDI,child);
    DeleteNode(child);
  }
  in_RDI->_lastChild = (XMLNode *)0x0;
  in_RDI->_firstChild = (XMLNode *)0x0;
  return;
}

Assistant:

void XMLNode::DeleteChildren()
{
    while( _firstChild ) {
        TIXMLASSERT( _lastChild );
        TIXMLASSERT( _firstChild->_document == _document );
        XMLNode* node = _firstChild;
        Unlink( node );

        DeleteNode( node );
    }
    _firstChild = _lastChild = 0;
}